

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

size_t tinyusdz::Usd_IntegerCompression64::CompressToBuffer
                 (uint64_t *ints,size_t numInts,char *compressed,string *err)

{
  size_t sVar1;
  string *err_local;
  char *compressed_local;
  size_t numInts_local;
  uint64_t *ints_local;
  
  sVar1 = anon_unknown_0::_CompressIntegers<unsigned_long>(ints,numInts,compressed,err);
  return sVar1;
}

Assistant:

size_t
Usd_IntegerCompression64::CompressToBuffer(
    uint64_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}